

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PP_FDTD_1D.cpp
# Opt level: O2

bool __thiscall PP_FDTD_1D::run(PP_FDTD_1D *this,bool shortCircuit,bool borderExcitationON)

{
  double **ppdVar1;
  double **ppdVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  unsigned_long n;
  ulong uVar6;
  double dVar7;
  
  calculateCoefficients(this);
  (*this->_vptr_PP_FDTD_1D[2])(this);
  uVar3 = 1;
  for (uVar6 = uVar3; uVar6 < this->Nt; uVar6 = uVar6 + 1) {
    uVar4 = this->Nz;
    ppdVar1 = this->I;
    ppdVar2 = this->V;
    for (uVar5 = uVar3; uVar5 < uVar4; uVar5 = uVar5 + 1) {
      ppdVar1[uVar6][uVar5] =
           (ppdVar2[uVar6 - 1][uVar5] - ppdVar2[uVar6 - 1][uVar5 - 1]) * this->c1 +
           this->c2 * ppdVar1[uVar6 - 1][uVar5];
    }
    dVar7 = 0.0;
    if (shortCircuit) {
      dVar7 = this->I[uVar6][1];
    }
    *this->I[uVar6] = dVar7;
    if (borderExcitationON) {
      (*this->_vptr_PP_FDTD_1D[3])(this,uVar6);
      uVar4 = this->Nz;
      ppdVar1 = this->I;
      ppdVar2 = this->V;
      for (uVar5 = uVar3; uVar5 < uVar4 - 1; uVar5 = uVar5 + 1) {
        ppdVar2[uVar6][uVar5] =
             (ppdVar1[uVar6][uVar5 + 1] - ppdVar1[uVar6][uVar5]) * this->c3 +
             this->c4 * ppdVar2[uVar6 - 1][uVar5];
      }
    }
    else {
      ppdVar1 = this->I;
      ppdVar2 = this->V;
      for (uVar5 = uVar3; uVar4 != uVar5; uVar5 = uVar5 + 1) {
        ppdVar2[uVar6][uVar5 - 1] =
             (ppdVar1[uVar6][uVar5] - ppdVar1[uVar6][uVar5 - 1]) * this->c3 +
             this->c4 * ppdVar2[uVar6 - 1][uVar5 - 1];
      }
    }
    dVar7 = 0.0;
    if (!shortCircuit) {
      dVar7 = this->V[uVar6][uVar4 - 2];
    }
    this->V[uVar6][uVar4 - 1] = dVar7;
  }
  return true;
}

Assistant:

bool PP_FDTD_1D::run(bool shortCircuit, bool borderExcitationON)
{
    //determine the coefficient of numerical iteration equations
    calculateCoefficients();

    //at t=0 initialize the whole space
    intialState();

    //iterations
    for(unsigned long n=1 ; n<Nt ; n++) //loop over time
    {
        //determine the next current over the whole space
        for(unsigned long k=1 ; k<Nz ; k++) //loop over space : may be multithread
        {
            //I[n][k] stands for i(k*dz, (n+0.5)*dt)
            //V[n][k] stands for v((k+0.5)*dz, n*dt)
            I[n][k] = c1*(V[n-1][k]-V[n-1][k-1]) + c2*I[n-1][k];

        }
        //border conditions for current: on the left because it is the state that cannot be calculated (correct me if I am wrong)
        if(shortCircuit)
        {
            I[n][0] = I[n][1];
        }
        else
        {
            I[n][0] = 0.0;
        }

        //deternmine the next voltage state
        if(borderExcitationON) //if we apply an excitation (input voltage)
        {
            borderExcitation(n);
            for(unsigned long k=1 ; k<(Nz-1) ; k++)
            {
                V[n][k] = c3*(I[n][k+1]-I[n][k]) + c4*V[n-1][k];
            }
        }
        else
        {
            for(unsigned long k=0 ; k<(Nz-1) ; k++)
            {
                V[n][k] = c3*(I[n][k+1]-I[n][k]) + c4*V[n-1][k];
            }
        }
        //boundary conditions on voltage: either 0 to simulate a short circuit or a miror condition for an open circuit
        if(shortCircuit)
        {
            V[n][Nz-1] = 0.0;
        }
        else
        {
            V[n][Nz-1] = V[n][Nz-2];
        }

    }

    return true;
}